

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O0

void heap_sort(int *a,int n)

{
  int local_18;
  int i;
  int n_local;
  int *a_local;
  
  for (local_18 = 1; local_18 < n; local_18 = local_18 + 1) {
    sift_up(a + -1,local_18 + 1);
  }
  while (local_18 = local_18 + -1, 0 < local_18) {
    swap(a,0,local_18);
    sift_down(a + -1,local_18);
  }
  return;
}

Assistant:

static void
heap_sort(int *a, int n)
{
    int i;
    for (i = 1; i < n; ++i) {
        sift_up(a-1, i+1);
    }
    --i;
    while (i > 0) {
        swap(a, 0, i);
        sift_down(a-1, i--);
    }
}